

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hud.cpp
# Opt level: O0

void __thiscall CHud::RenderGameTimer(CHud *this)

{
  int iVar1;
  IClient *pIVar2;
  int64 iVar3;
  ITextRender *pIVar4;
  char *pcVar5;
  long in_RDI;
  long in_FS_OFFSET;
  char *pText;
  float Alpha;
  int Time;
  float x;
  char aBuf [32];
  float in_stack_ffffffffffffff78;
  float in_stack_ffffffffffffff7c;
  undefined4 in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff84;
  char *in_stack_ffffffffffffff88;
  undefined7 in_stack_ffffffffffffff90;
  undefined1 in_stack_ffffffffffffff97;
  int in_stack_ffffffffffffff98;
  float in_stack_ffffffffffffff9c;
  int in_stack_ffffffffffffffa0;
  int in_stack_ffffffffffffffa4;
  undefined4 local_48;
  int local_38;
  char local_28 [32];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  CComponent::Graphics((CComponent *)0x162ff0);
  IGraphics::ScreenAspect
            ((IGraphics *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
  if ((*(uint *)(*(long *)(*(long *)(in_RDI + 8) + 0xdf8) + 4) & 2) == 0) {
    if ((*(int *)(*(long *)(in_RDI + 8) + 0x1b164) == 0) ||
       ((*(uint *)(*(long *)(*(long *)(in_RDI + 8) + 0xdf8) + 4) & 1) != 0)) {
      if ((*(uint *)(*(long *)(*(long *)(in_RDI + 8) + 0xdf8) + 4) & 0xc) == 0) {
        pIVar2 = CComponent::Client((CComponent *)0x163157);
        in_stack_ffffffffffffff98 = IClient::GameTick(pIVar2);
        in_stack_ffffffffffffff98 =
             in_stack_ffffffffffffff98 - **(int **)(*(long *)(in_RDI + 8) + 0xdf8);
        pIVar2 = CComponent::Client((CComponent *)0x16317a);
        local_38 = IClient::GameTickSpeed(pIVar2);
        local_38 = in_stack_ffffffffffffff98 / local_38;
      }
      else {
        in_stack_ffffffffffffff9c = *(float *)(*(long *)(*(long *)(in_RDI + 8) + 0xdf8) + 8);
        pIVar2 = CComponent::Client((CComponent *)0x163136);
        local_38 = IClient::GameTickSpeed(pIVar2);
        local_38 = (int)in_stack_ffffffffffffff9c / local_38;
      }
    }
    else {
      in_stack_ffffffffffffffa0 = *(int *)(*(long *)(in_RDI + 8) + 0x1b164) * 0x3c;
      pIVar2 = CComponent::Client((CComponent *)0x163097);
      in_stack_ffffffffffffffa4 = IClient::GameTick(pIVar2);
      in_stack_ffffffffffffffa4 =
           in_stack_ffffffffffffffa4 - **(int **)(*(long *)(in_RDI + 8) + 0xdf8);
      pIVar2 = CComponent::Client((CComponent *)0x1630ba);
      iVar1 = IClient::GameTickSpeed(pIVar2);
      local_38 = in_stack_ffffffffffffffa0 - in_stack_ffffffffffffffa4 / iVar1;
      if ((*(uint *)(*(long *)(*(long *)(in_RDI + 8) + 0xdf8) + 4) & 0xc) != 0) {
        local_38 = 0;
      }
    }
  }
  else {
    local_38 = 0;
  }
  if ((RenderGameTimer()::s_Cursor == '\0') &&
     (iVar1 = __cxa_guard_acquire(&RenderGameTimer()::s_Cursor), iVar1 != 0)) {
    CTextCursor::CTextCursor
              ((CTextCursor *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
               in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98);
    __cxa_atexit(CTextCursor::~CTextCursor,&RenderGameTimer::s_Cursor,&__dso_handle);
    __cxa_guard_release(&RenderGameTimer()::s_Cursor);
  }
  CTextCursor::MoveTo((CTextCursor *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                      in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78);
  RenderGameTimer::s_Cursor.m_Align = 1;
  CTextCursor::Reset((CTextCursor *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                     CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
  str_format(local_28,0x20,"%d:%02d",(long)local_38 / 0x3c & 0xffffffff,
             (long)local_38 % 0x3c & 0xffffffff);
  local_48 = 0x3f800000;
  if (((*(int *)(*(long *)(in_RDI + 8) + 0x1b164) != 0) && (local_38 < 0x3d)) &&
     ((*(uint *)(*(long *)(*(long *)(in_RDI + 8) + 0xdf8) + 4) & 1) == 0)) {
    in_stack_ffffffffffffff97 = false;
    if (local_38 < 0xb) {
      iVar3 = time_get();
      in_stack_ffffffffffffff88 = (char *)(iVar3 << 1);
      iVar3 = time_freq();
      in_stack_ffffffffffffff97 = ((long)in_stack_ffffffffffffff88 / iVar3) % 2 != 0;
    }
    in_stack_ffffffffffffff80 = 0x3f800000;
    local_48 = 0x3f000000;
    if ((bool)in_stack_ffffffffffffff97 == false) {
      local_48 = 0x3f800000;
    }
    in_stack_ffffffffffffff84 = local_48;
    pIVar4 = CComponent::TextRender((CComponent *)0x16332a);
    (*(pIVar4->super_IInterface)._vptr_IInterface[4])(0x3f800000,0x3e800000);
  }
  pIVar4 = CComponent::TextRender((CComponent *)0x163378);
  (*(pIVar4->super_IInterface)._vptr_IInterface[7])
            (pIVar4,&RenderGameTimer::s_Cursor,local_28,0xffffffff);
  pIVar4 = CComponent::TextRender((CComponent *)0x16339c);
  (*(pIVar4->super_IInterface)._vptr_IInterface[0x10])
            (local_48,pIVar4,&RenderGameTimer::s_Cursor,0,0xffffffff);
  pIVar4 = CComponent::TextRender((CComponent *)0x1633c6);
  (*(pIVar4->super_IInterface)._vptr_IInterface[4])(0x3f800000,0x3f800000,0x3f800000);
  if ((*(uint *)(*(long *)(*(long *)(in_RDI + 8) + 0xdf8) + 4) & 2) != 0) {
    if ((RenderGameTimer()::s_SuddenDeathCursor == '\0') &&
       (iVar1 = __cxa_guard_acquire(&RenderGameTimer()::s_SuddenDeathCursor), iVar1 != 0)) {
      CTextCursor::CTextCursor
                ((CTextCursor *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                 in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98);
      __cxa_atexit(CTextCursor::~CTextCursor,&RenderGameTimer::s_SuddenDeathCursor,&__dso_handle);
      __cxa_guard_release(&RenderGameTimer()::s_SuddenDeathCursor);
    }
    CTextCursor::MoveTo((CTextCursor *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80)
                        ,in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78);
    RenderGameTimer::s_SuddenDeathCursor.m_Align = 1;
    CLocalizationDatabase::Version(&g_Localization);
    CTextCursor::Reset((CTextCursor *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                       CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
    pcVar5 = Localize((char *)CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90),
                      in_stack_ffffffffffffff88);
    pIVar4 = CComponent::TextRender((CComponent *)0x1634b8);
    (*(pIVar4->super_IInterface)._vptr_IInterface[0xb])
              (pIVar4,&RenderGameTimer::s_SuddenDeathCursor,pcVar5,0xffffffff);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void CHud::RenderGameTimer()
{
	float x = 300.0f*Graphics()->ScreenAspect()/2.0f;

	int Time = 0;
	if(m_pClient->m_Snap.m_pGameData->m_GameStateFlags&GAMESTATEFLAG_SUDDENDEATH)
		Time = 0;
	else if(m_pClient->m_GameInfo.m_TimeLimit && !(m_pClient->m_Snap.m_pGameData->m_GameStateFlags&GAMESTATEFLAG_WARMUP))
	{
		Time = m_pClient->m_GameInfo.m_TimeLimit*60 - ((Client()->GameTick()-m_pClient->m_Snap.m_pGameData->m_GameStartTick)/Client()->GameTickSpeed());

		if(m_pClient->m_Snap.m_pGameData->m_GameStateFlags&(GAMESTATEFLAG_ROUNDOVER|GAMESTATEFLAG_GAMEOVER))
			Time = 0;
	}
	else if(m_pClient->m_Snap.m_pGameData->m_GameStateFlags&(GAMESTATEFLAG_ROUNDOVER|GAMESTATEFLAG_GAMEOVER))
		Time = m_pClient->m_Snap.m_pGameData->m_GameStateEndTick/Client()->GameTickSpeed();
	else
		Time = (Client()->GameTick()-m_pClient->m_Snap.m_pGameData->m_GameStartTick)/Client()->GameTickSpeed();

	static CTextCursor s_Cursor(10.0f);
	s_Cursor.MoveTo(x, 2.0f);
	s_Cursor.m_Align = TEXTALIGN_TC;
	s_Cursor.Reset(Time);

	char aBuf[32];
	str_format(aBuf, sizeof(aBuf), "%d:%02d", Time/60, Time%60);

	// last 60 sec red, last 10 sec blink
	float Alpha = 1.0f;
	if(m_pClient->m_GameInfo.m_TimeLimit && Time <= 60 && !(m_pClient->m_Snap.m_pGameData->m_GameStateFlags&GAMESTATEFLAG_WARMUP))
	{
		Alpha = Time <= 10 && (2*time_get()/time_freq()) % 2 ? 0.5f : 1.0f;
		TextRender()->TextColor(1.0f, 0.25f, 0.25f, 1.0f);
	}
	TextRender()->TextDeferred(&s_Cursor, aBuf, -1.0f);
	TextRender()->DrawTextOutlined(&s_Cursor, Alpha);
	TextRender()->TextColor(1.0f, 1.0f, 1.0f, 1.0f);

	if(m_pClient->m_Snap.m_pGameData->m_GameStateFlags&GAMESTATEFLAG_SUDDENDEATH)
	{
		static CTextCursor s_SuddenDeathCursor(12.0f);
		s_SuddenDeathCursor.MoveTo(x, 14.0f);
		s_SuddenDeathCursor.m_Align = TEXTALIGN_TC;
		s_SuddenDeathCursor.Reset(g_Localization.Version());
		const char *pText = Localize("Sudden Death");
		TextRender()->TextOutlined(&s_SuddenDeathCursor, pText, -1);
	}
}